

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O3

bool __thiscall CaptureSummary::Merge(CaptureSummary *this,char *list_file_name)

{
  bool bVar1;
  FILE *__stream;
  char *pcVar2;
  size_t __n;
  char **ppcVar3;
  CaptureSummary **cs;
  CaptureSummary *pCVar4;
  ulong uVar5;
  ulong uVar6;
  char **file_name;
  ulong nb_files;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  char buffer [512];
  ulong local_268;
  undefined8 local_240;
  char local_238 [520];
  
  __stream = (FILE *)ithi_file_open(list_file_name,"r");
  if (__stream == (FILE *)0x0) {
    return false;
  }
  pcVar2 = fgets(local_238,0x200,__stream);
  if (pcVar2 == (char *)0x0) {
    file_name = (char **)0x0;
    nb_files = 0;
  }
  else {
    nb_files = 0;
    file_name = (char **)0x0;
    local_268 = 0;
    do {
      __n = strlen(local_238);
      if (__n != 0) {
LAB_00151b9e:
        if (((ulong)(byte)local_238[__n - 1] < 0x21) &&
           ((0x100002600U >> ((ulong)(byte)local_238[__n - 1] & 0x3f) & 1) != 0))
        goto code_r0x00151baf;
        ppcVar3 = file_name;
        if (local_268 <= nb_files) {
          uVar6 = local_268 * 2;
          if (local_268 == 0) {
            uVar6 = 0x200;
          }
          ppcVar3 = (char **)operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
          if (local_268 != 0) {
            uVar7 = 0;
            do {
              ppcVar3[uVar7] = file_name[uVar7];
              file_name[uVar7] = (char *)0x0;
              uVar7 = uVar7 + 1;
            } while (local_268 != uVar7);
          }
          if (local_268 < uVar6) {
            memset(ppcVar3 + local_268,0,uVar6 * 8 + local_268 * -8);
          }
          local_268 = uVar6;
          if (file_name != (char **)0x0) {
            operator_delete__(file_name);
          }
        }
        file_name = ppcVar3;
        pcVar2 = (char *)operator_new__(__n + 1);
        file_name[nb_files] = pcVar2;
        memcpy(pcVar2,local_238,__n);
        file_name[nb_files][__n] = '\0';
        nb_files = nb_files + 1;
      }
LAB_00151c94:
      pcVar2 = fgets(local_238,0x200,__stream);
    } while (pcVar2 != (char *)0x0);
  }
  if (nb_files < 0x81) {
    bVar1 = Merge(this,nb_files,file_name);
    goto LAB_00151dee;
  }
  uVar6 = nb_files + 0x7f;
  uVar7 = uVar6 >> 7;
  cs = (CaptureSummary **)operator_new__(uVar7 * 8);
  if (uVar6 < 0x80) {
LAB_00151d75:
    bVar1 = Merge(this,uVar7,cs);
  }
  else {
    uVar5 = 1;
    uVar8 = 0;
    local_240 = uVar6;
    do {
      pCVar4 = (CaptureSummary *)operator_new(0x20);
      CaptureSummary(pCVar4);
      uVar6 = uVar8 + 0x80;
      if (nb_files <= uVar8 + 0x80) {
        uVar6 = nb_files;
      }
      cs[uVar5 - 1] = pCVar4;
      bVar1 = Merge(pCVar4,uVar6 - uVar8,file_name + uVar8);
    } while ((bVar1) && (bVar9 = uVar5 < uVar7, uVar5 = uVar5 + 1, uVar8 = uVar6, bVar9));
    uVar6 = local_240;
    if (bVar1) goto LAB_00151d75;
    bVar1 = false;
  }
  if (0x7f < uVar6) {
    uVar6 = 0;
    do {
      pCVar4 = cs[uVar6];
      if (pCVar4 != (CaptureSummary *)0x0) {
        ~CaptureSummary(pCVar4);
        operator_delete(pCVar4);
        cs[uVar6] = (CaptureSummary *)0x0;
      }
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  operator_delete__(cs);
LAB_00151dee:
  if (file_name != (char **)0x0) {
    if (nb_files != 0) {
      uVar6 = 0;
      do {
        if (file_name[uVar6] != (char *)0x0) {
          operator_delete__(file_name[uVar6]);
        }
        file_name[uVar6] = (char *)0x0;
        uVar6 = uVar6 + 1;
      } while (nb_files != uVar6);
    }
    operator_delete__(file_name);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return bVar1;
code_r0x00151baf:
  local_238[__n] = '\0';
  __n = __n - 1;
  if (__n == 0) goto LAB_00151c94;
  goto LAB_00151b9e;
}

Assistant:

bool CaptureSummary::Merge(char const * list_file_name)
{
    size_t nb_alloc = 0;
    char ** file_list = NULL;
    size_t nb_files = 0;
    FILE* F;
    char buffer[512];
    const size_t batch_size = 128;

    /* Open the list file */
    bool ret;
    F = ithi_file_open(list_file_name, "r");
    ret = (F != NULL);

    /* Read each file name and add it to the list */
    while (ret && fgets(buffer, sizeof(buffer), F) != NULL) {
        /* Clean up the end of the buffer */
        size_t len = strlen(buffer);

        while (len > 0 && (buffer[len-1] == ' ' || buffer[len-1] == '\t' || buffer[len-1] == '\r' || buffer[len-1] == '\n')) {
            buffer[len--] = 0;
        }

        if (len == 0)
        {
            continue;
        }

        /* Allocate memory if necessary */
        if (nb_files >= nb_alloc) {
            size_t new_len = (nb_alloc == 0) ? 512 : 2 * nb_alloc;
            char ** new_list = new char*[new_len];

            if (new_list == NULL) {
                ret = false;
            }
            else
            {
                size_t i = 0;
                while (i < nb_alloc){
                    new_list[i] = file_list[i];
                    file_list[i++] = NULL;
                }
                while (i < new_len) {
                    new_list[i++] = NULL;
                }

                if (file_list != NULL) {
                    delete[] file_list;
                }
                file_list = new_list;
                nb_alloc = new_len;
            }
        }

        /* Record the name */
        if (ret)
        {
            file_list[nb_files] = new char[len + 1];
            if (file_list[nb_files] == NULL)
            {
                ret = false;
            }
            else
            {
                memcpy(file_list[nb_files], buffer, len);
                file_list[nb_files][len] = 0;
                nb_files++;
            }
        }
    }


    /* Merge the list */
    if (ret)
    {
        /* Create intermediate merge files if there are more than 100 summaries */
        if (nb_files > batch_size) {
            size_t nb_compiled = 0;
            size_t nb_intermediate_summaries = (nb_files + batch_size - 1) / batch_size;
            size_t nb_created = 0;
            CaptureSummary** intermediate_list = new  CaptureSummary * [nb_intermediate_summaries];

            if (intermediate_list == NULL) {
                ret = false;
            }
            else {
                for (size_t i = 0; ret && i < nb_intermediate_summaries; i++) {
                    intermediate_list[i] = new CaptureSummary();
                    if (intermediate_list[i] == NULL) {
                        ret = false;
                        for (size_t j = nb_created; j < nb_intermediate_summaries; j++) {
                            intermediate_list[j] = NULL;
                        }
                    }
                    else {
                        nb_created++;
                        size_t first_file = nb_compiled;
                        nb_compiled += batch_size;
                        if (nb_compiled > nb_files) {
                            nb_compiled = nb_files;
                        }
                        ret = intermediate_list[i]->Merge(nb_compiled - first_file, (char const**)(file_list + first_file));
                    }
                }

                if (ret) {
                    /* Merge all the summaries */
                    ret = Merge(nb_intermediate_summaries, intermediate_list);
                }
                /* Clean up all the intermediate summaries */
                for (size_t i = 0; i < nb_intermediate_summaries; i++) {
                    if (intermediate_list[i] != NULL) {
                        delete intermediate_list[i];
                        intermediate_list[i] = NULL;
                    }
                }
                delete[] intermediate_list;
            }
        }
        else {
            ret = Merge(nb_files, (char const**)file_list);
        }
    }

    /* Clean up */
    if (file_list != NULL)
    {
        for (size_t i = 0; i < nb_files; i++)
        {
            delete[] file_list[i];
            file_list[i] = NULL;
        }

        delete[] file_list;
    }

    if (F != NULL)
    {
        fclose(F);
    }

    return ret;
}